

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O0

string * generateStringVector<std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>,helics::FilterFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__2>
                   (string *param_1,anon_class_1_0_00000001 *param_2)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  GlobalHandle *ele;
  const_iterator __end0;
  const_iterator __begin0;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range1;
  string *ret;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  local_40;
  anon_class_1_0_00000001 *local_38;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar4;
  anon_class_1_0_00000001 *this_00;
  
  uVar4 = 0;
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffe6;
  this = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_38 = param_2;
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe6);
  this_00 = local_38;
  local_40._M_current =
       (GlobalHandle *)
       std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                 ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)param_1);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)param_1);
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                           ((__normal_iterator<const_helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                             *)this,(__normal_iterator<const_helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                     *)param_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
    ::operator*(&local_40);
    const::$_2::operator()(this_00,(GlobalHandle *)CONCAT17(uVar4,in_stack_ffffffffffffffe0));
    helics::generateJsonQuotedString(in_stack_ffffffffffffff88);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffff70,__str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff70,(char)((ulong)__str >> 0x38));
    __gnu_cxx::
    __normal_iterator<const_helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
    ::operator++(&local_40);
  }
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  if (sVar2 < 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff70,(char)((ulong)__str >> 0x38));
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    *pvVar3 = ']';
  }
  return param_1;
}

Assistant:

std::string generateStringVector(const X& data, Proc generator)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        ret.append(helics::generateJsonQuotedString(generator(ele)));
        ret.push_back(',');
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}